

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall testing::internal::FilePath::FilePath(FilePath *this,string *pathname)

{
  pointer pcVar1;
  
  (this->pathname_)._M_dataplus._M_p = (pointer)&(this->pathname_).field_2;
  pcVar1 = (pathname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + pathname->_M_string_length);
  Normalize(this);
  return;
}

Assistant:

explicit FilePath(const std::string& pathname) : pathname_(pathname) {
    Normalize();
  }